

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  undefined1 extraout_var [12];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  ImVec2 size_desired;
  ImVec2 local_50;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  ImVec2 local_20;
  
  pIVar1 = GImGui;
  fVar6 = ImGuiWindow::TitleBarHeight(window);
  local_38 = ImGuiWindow::MenuBarHeight(window);
  uStack_34 = extraout_var._0_4_;
  uStack_30 = extraout_var._4_4_;
  uStack_2c = extraout_var._8_4_;
  local_38 = local_38 + fVar6;
  local_48 = (window->WindowPadding).x;
  fStack_44 = (window->WindowPadding).y;
  local_48 = local_48 + local_48;
  fStack_44 = fStack_44 + fStack_44;
  local_50.x = (*size_contents).x + local_48 + 0.0;
  local_50.y = local_38 + (*size_contents).y + fStack_44;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    local_20 = (pIVar1->Style).WindowMinSize;
    auVar12._8_8_ = 0;
    auVar12._0_4_ = local_20.x;
    auVar12._4_4_ = local_20.y;
    uStack_40 = 0;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar12 = minps(auVar12,_DAT_00194bc0);
      local_20 = auVar12._0_8_;
    }
    IVar7 = (pIVar1->Style).DisplaySafeAreaPadding;
    fVar13 = IVar7.x;
    fVar6 = IVar7.y;
    IVar7 = (pIVar1->IO).DisplaySize;
    fVar13 = IVar7.x - (fVar13 + fVar13);
    fVar6 = IVar7.y - (fVar6 + fVar6);
    uVar4 = -(uint)(fVar13 <= local_20.x);
    uVar5 = -(uint)(fVar6 <= local_20.y);
    IVar7 = ImClamp(&local_50,&local_20,
                    (ImVec2)(CONCAT44(~uVar5 & (uint)fVar6,~uVar4 & (uint)fVar13) |
                            CONCAT44((uint)local_20.y & uVar5,(uint)local_20.x & uVar4)));
    IVar8 = CalcWindowSizeAfterConstraint(window,IVar7);
    uVar4 = window->Flags;
    bVar2 = 1;
    cVar3 = '\x01';
    if (size_contents->x <= IVar8.x - local_48 || (uVar4 & 0x808) != 0x800) {
      cVar3 = (char)((uVar4 & 0xffff) >> 0xf);
    }
    if (size_contents->y <= (IVar8.y - fStack_44) - local_38 || (uVar4 & 8) != 0) {
      bVar2 = (byte)(uVar4 >> 0xe) & 1;
    }
    auVar10._8_8_ = extraout_XMM0_Qb;
    auVar10._0_4_ = IVar7.x;
    auVar10._4_4_ = IVar7.y;
    auVar9._0_4_ = IVar7.x;
    auVar9._8_4_ = (undefined4)extraout_XMM0_Qb;
    auVar9._12_4_ = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
    if (cVar3 != '\0') {
      auVar9._4_4_ = IVar7.y + (pIVar1->Style).ScrollbarSize;
      auVar10 = auVar9;
    }
    local_50 = auVar10._0_8_;
    if (bVar2 != 0) {
      auVar11._4_12_ = auVar10._4_12_;
      auVar11._0_4_ = auVar10._0_4_ + (pIVar1->Style).ScrollbarSize;
      local_50 = auVar11._0_8_;
    }
  }
  return local_50;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}